

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

Clause * __thiscall
Inferences::resolveClausesHelper
          (Inferences *this,InductionContext *context,Stack<Kernel::Clause_*> *cls,
          ElementIterator eIt,Substitution *subst,bool generalized,bool applySubst,
          Substitution *indLitSubst)

{
  Unit *elem;
  undefined8 *puVar1;
  Self SVar2;
  uint uVar3;
  List<Kernel::Unit_*> *l;
  Literal *pLVar4;
  Literal *lit;
  Unit *pUVar5;
  Literal *pLVar6;
  Clause *pCVar7;
  long lVar8;
  ulong uVar9;
  int res_1;
  int iVar10;
  Inferences *pIVar11;
  int res;
  undefined8 *puVar12;
  Inferences *pIVar13;
  uint uVar14;
  undefined7 in_stack_00000011;
  RStack<Literal_*> resLits;
  TermReplacement tr;
  _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
  local_190;
  Inference inf;
  RobSubstitution renaming;
  Inference local_68;
  
  Kernel::RobSubstitution::RobSubstitution(&renaming);
  iVar10 = *(int *)(eIt._0_8_ + (long)(int)cls * 4);
  elem = (Unit *)(context->_indTerms).
                 super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[(int)cls];
  l = Lib::List<Kernel::Unit_*>::singleton(elem);
  while (iVar10 != -1) {
    lVar8 = (long)iVar10;
    iVar10 = *(int *)(eIt._0_8_ + lVar8 * 4);
    l = Lib::List<Kernel::Unit_*>::cons
                  ((Unit *)(context->_indTerms).
                           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish[lVar8],l);
  }
  pIVar13 = this + 0x28;
  pIVar11 = pIVar13;
  while (pIVar11 = *(Inferences **)pIVar11, pIVar11 != (Inferences *)0x0) {
    l = Lib::List<Kernel::Unit_*>::cons(*(Unit **)(pIVar11 + 8),l);
  }
  tr.super_TermTransformer.super_TermTransformerCommon._vptr_TermTransformerCommon._0_1_ = 'G';
  if ((char)subst == '\0') {
    tr.super_TermTransformer.super_TermTransformerCommon._vptr_TermTransformerCommon._0_1_ =
         (CONCAT71(in_stack_00000011,applySubst) != 0) * '\x02' + 'F';
  }
  tr._m._M_t._M_impl._0_8_ = l;
  Kernel::Inference::Inference(&inf,(GeneratingInferenceMany *)&tr);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&resLits);
  uVar3 = elem[1]._number & 0xfffff;
  uVar14 = (uint)(uVar3 != 0);
  pUVar5 = (Unit *)0x0;
  if (uVar3 != 0) {
    pUVar5 = elem + 2;
  }
  do {
    if (pUVar5 == (Unit *)0x0) {
      do {
        pIVar13 = *(Inferences **)pIVar13;
        if (pIVar13 == (Inferences *)0x0) {
          local_68._0_8_ = inf._0_8_;
          local_68._8_4_ = inf._8_4_;
          local_68._age = inf._age;
          local_68._splits = inf._splits;
          local_68._ptr1 = inf._ptr1;
          local_68._ptr2 = inf._ptr2;
          local_68.th_ancestors = inf.th_ancestors;
          local_68.all_ancestors = inf.all_ancestors;
          pCVar7 = Kernel::Clause::fromStack
                             ((Stack<Kernel::Literal_*> *)
                              resLits._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl,&local_68);
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&resLits);
          Kernel::RobSubstitution::~RobSubstitution(&renaming);
          return pCVar7;
        }
        for (uVar9 = 0; uVar9 < ((uint)*(undefined8 *)(*(long *)(pIVar13 + 8) + 0x38) & 0xfffff);
            uVar9 = uVar9 + 1) {
          puVar12 = *(undefined8 **)(pIVar13 + 0x18);
          puVar1 = *(undefined8 **)(pIVar13 + 0x20);
          do {
            if (puVar12 == puVar1) {
              pLVar6 = *(Literal **)(*(long *)(pIVar13 + 8) + 0x70 + uVar9 * 8);
              if ((Substitution *)CONCAT71(in_stack_00000011,applySubst) != (Substitution *)0x0) {
                pLVar6 = Kernel::SubstHelper::apply<Kernel::Substitution>
                                   (pLVar6,(Substitution *)CONCAT71(in_stack_00000011,applySubst));
                getContextReplacementMap
                          ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                            *)&local_190,(InductionContext *)this,true);
                TermReplacement::TermReplacement
                          (&tr,(map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                                *)&local_190);
                std::
                _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                ::~_Rb_tree(&local_190);
                pLVar6 = Kernel::TermTransformerCommon::transformLiteral
                                   ((TermTransformerCommon *)&tr,pLVar6);
                TermReplacement::~TermReplacement(&tr);
              }
              SVar2._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   resLits._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
              pLVar6 = Kernel::RobSubstitution::apply(&renaming,pLVar6,1);
              Lib::Stack<Kernel::Literal_*>::push
                        ((Stack<Kernel::Literal_*> *)
                         SVar2._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                         ,pLVar6);
              break;
            }
            getContextReplacementMap
                      ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)&local_190,(InductionContext *)this,true);
            TermReplacement::TermReplacement
                      (&tr,(map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                            *)&local_190);
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree(&local_190);
            pLVar4 = Kernel::TermTransformerCommon::transformLiteral
                               ((TermTransformerCommon *)&tr,(Literal *)*puVar12);
            pLVar6 = *(Literal **)(*(long *)(pIVar13 + 8) + 0x70 + uVar9 * 8);
            TermReplacement::~TermReplacement(&tr);
            puVar12 = puVar12 + 1;
          } while (pLVar4 != pLVar6);
        }
      } while( true );
    }
    pLVar6 = *(Literal **)pUVar5;
    pLVar4 = Kernel::Literal::complementaryLiteral(pLVar6);
    pLVar4 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar4,(Substitution *)eIt._data);
    pIVar11 = pIVar13;
    while (pIVar11 = *(Inferences **)pIVar11, pIVar11 != (Inferences *)0x0) {
      puVar12 = *(undefined8 **)(pIVar11 + 0x18);
      puVar1 = *(undefined8 **)(pIVar11 + 0x20);
      while (puVar12 != puVar1) {
        lit = (Literal *)*puVar12;
        if ((Substitution *)CONCAT71(in_stack_00000011,applySubst) != (Substitution *)0x0) {
          lit = Kernel::SubstHelper::apply<Kernel::Substitution>
                          (lit,(Substitution *)CONCAT71(in_stack_00000011,applySubst));
        }
        puVar12 = puVar12 + 1;
        if (lit == pLVar4) goto LAB_003fa9af;
      }
    }
    if (generalized) {
      getContextReplacementMap
                ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                  *)&local_190,(InductionContext *)this,true);
      TermReplacement::TermReplacement
                (&tr,(map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                      *)&local_190);
      std::
      _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
      ::~_Rb_tree(&local_190);
      pLVar6 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar6,(Substitution *)eIt._data);
      pLVar6 = Kernel::TermTransformerCommon::transformLiteral((TermTransformerCommon *)&tr,pLVar6);
      TermReplacement::~TermReplacement(&tr);
    }
    SVar2._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         resLits._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
    pLVar6 = Kernel::RobSubstitution::apply(&renaming,pLVar6,0);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               SVar2._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar6);
LAB_003fa9af:
    pUVar5 = (Unit *)(&elem[2]._number + (long)(int)uVar14 * 2);
    if (uVar3 <= uVar14) {
      pUVar5 = (Unit *)0x0;
    }
    uVar14 = uVar14 + (uVar14 < uVar3);
  } while( true );
}

Assistant:

Clause* resolveClausesHelper(const InductionContext& context, const Stack<Clause*>& cls, IntUnionFind::ElementIterator eIt, Substitution& subst, bool generalized, bool applySubst, Substitution* indLitSubst)
{
  // first create the clause with the required size
  RobSubstitution renaming;
  ASS(eIt.hasNext());
  auto cl = cls[eIt.next()];
  auto premises = UnitList::singleton(cl);
  const auto& toResolve = context._cls;
  while (eIt.hasNext()) {
    auto other = cls[eIt.next()];
    UnitList::push(other,premises);
  }

  for (const auto& kv : toResolve) {
    UnitList::push(kv.first, premises);
  }

  Inference inf(GeneratingInferenceMany(
    generalized ? InferenceRule::GEN_INDUCTION_HYPERRESOLUTION
                : ( indLitSubst ? InferenceRule::FREE_VAR_INDUCTION_HYPERRESOLUTION : InferenceRule::INDUCTION_HYPERRESOLUTION),
    premises));
  RStack<Literal*> resLits;

  for (Literal* curr : cl->iterLits()) {
    auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral(curr), subst);
    bool contains = false;
    for (const auto& kv : toResolve) {
      for (const auto& lit : kv.second) {
        Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
        if (slit == clit) {
          contains = true;
          break;
        }
      }
      if (contains) {
        break;
      }
    }
    if (!contains) {
      Literal* resLit;
      if (applySubst) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        resLit = tr.transformLiteral(SubstHelper::apply<Substitution>(curr,subst));
      } else {
        resLit = curr;
      }
      resLits->push(renaming.apply(resLit,0));
    }
  }

  for (const auto& kv : toResolve) {
    for (unsigned i = 0; i < kv.first->length(); i++) {
      bool copyCurr = true;
      for (const auto& lit : kv.second) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        auto rlit = tr.transformLiteral(lit);
        if (rlit == (*kv.first)[i]) {
          copyCurr = false;
          break;
        }
      }
      if (copyCurr) {
        Literal* l = (*kv.first)[i];
        if (indLitSubst) {
          l = SubstHelper::apply<Substitution>((*kv.first)[i], *indLitSubst);
          TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
          l = tr.transformLiteral(l);
        }
        resLits->push(renaming.apply(l,1));
      }
    }
  }

  return Clause::fromStack(*resLits, inf);
}